

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

Tile * createTile(Image *image,int x,int y,int w,int h,
                 vector<Tile_*,_std::allocator<Tile_*>_> *tiles,bool mirrored)

{
  uint uVar1;
  pointer ppTVar2;
  bool bVar3;
  Tile *this;
  Tile *pTVar4;
  Tile *pTVar5;
  uchar *__dest;
  pointer __src;
  pointer ppTVar6;
  
  this = (Tile *)operator_new(0x50);
  Tile::Tile(this,0,false,false,false,(Tile *)0x0);
  if (0 < h) {
    uVar1 = image->width;
    __dest = this->data;
    __src = (image->pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start + (long)x + (ulong)(y * uVar1);
    do {
      memcpy(__dest,__src,(long)w);
      __dest = __dest + w;
      __src = __src + uVar1;
      h = h + -1;
    } while (h != 0);
  }
  ppTVar6 = (tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar2 = (tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar6 == ppTVar2) {
    pTVar4 = (Tile *)0x0;
  }
  else {
    do {
      pTVar4 = *ppTVar6;
      bVar3 = Tile::isDataEqual(this,pTVar4);
      if (bVar3) goto LAB_00115f52;
      ppTVar6 = ppTVar6 + 1;
    } while (ppTVar6 != ppTVar2);
    pTVar4 = (Tile *)0x0;
  }
LAB_00115f52:
  this->original_tile = pTVar4;
  if (pTVar4 != (Tile *)0x0) {
    this->is_duplicate = true;
  }
  if ((mirrored) && (this->is_duplicate == false)) {
    pTVar4 = Tile::flipX(this);
    ppTVar2 = (tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppTVar6 = (tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
                   super__Vector_impl_data._M_start; ppTVar6 != ppTVar2; ppTVar6 = ppTVar6 + 1) {
      pTVar5 = *ppTVar6;
      bVar3 = Tile::isDataEqual(pTVar4,pTVar5);
      if (bVar3) goto LAB_00115fb3;
    }
    pTVar5 = (Tile *)0x0;
LAB_00115fb3:
    this->original_tile = pTVar5;
    if (pTVar4 != (Tile *)0x0) {
      operator_delete(pTVar4);
    }
    if (this->original_tile == (Tile *)0x0) {
      pTVar4 = Tile::flipY(this);
      ppTVar2 = (tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppTVar6 = (tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
                     super__Vector_impl_data._M_start; ppTVar6 != ppTVar2; ppTVar6 = ppTVar6 + 1) {
        pTVar5 = *ppTVar6;
        bVar3 = Tile::isDataEqual(pTVar4,pTVar5);
        if (bVar3) goto LAB_00116012;
      }
      pTVar5 = (Tile *)0x0;
LAB_00116012:
      this->original_tile = pTVar5;
      if (pTVar4 != (Tile *)0x0) {
        operator_delete(pTVar4);
      }
      if (this->original_tile == (Tile *)0x0) {
        pTVar4 = Tile::flipXY(this);
        ppTVar2 = (tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        for (ppTVar6 = (tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
                       super__Vector_impl_data._M_start; ppTVar6 != ppTVar2; ppTVar6 = ppTVar6 + 1)
        {
          pTVar5 = *ppTVar6;
          bVar3 = Tile::isDataEqual(pTVar4,pTVar5);
          if (bVar3) goto LAB_0011606e;
        }
        pTVar5 = (Tile *)0x0;
LAB_0011606e:
        this->original_tile = pTVar5;
        if (pTVar4 != (Tile *)0x0) {
          operator_delete(pTVar4);
        }
        if (this->original_tile == (Tile *)0x0) {
          return this;
        }
        this->flipped_x = true;
        this->flipped_y = true;
      }
      else {
        this->flipped_y = true;
      }
    }
    else {
      this->flipped_x = true;
    }
    this->is_duplicate = true;
  }
  return this;
}

Assistant:

Tile *createTile(Image *image, int x, int y, int w, int h, std::vector<Tile *> *tiles, bool mirrored) {
    Tile *tile = new Tile(0, false, false, false, nullptr);

    unsigned char *ptr = &image->pixels[0] + y * image->width + x;
    unsigned char *tile_ptr = tile->data;
    for (int i = 0; i < h; i++) {
        memcpy(tile_ptr, ptr, w);
        tile_ptr += w;
        ptr += image->width;
    }

    tile->original_tile = find_duplicate(tile, tiles);
    if (tile->original_tile) {
        tile->is_duplicate = true;
    }

    if (mirrored && !tile->is_duplicate) {
        Tile *flipped = tile->flipX();
        tile->original_tile = find_duplicate(flipped, tiles);
        delete flipped;
        if (tile->original_tile) {
            tile->flipped_x = true;
            tile->is_duplicate = true;
        } else {
            flipped = tile->flipY();
            tile->original_tile = find_duplicate(flipped, tiles);
            delete flipped;
            if (tile->original_tile) {
                tile->flipped_y = true;
                tile->is_duplicate = true;
            } else {
                flipped = tile->flipXY();
                tile->original_tile = find_duplicate(flipped, tiles);
                delete flipped;
                if (tile->original_tile) {
                    tile->flipped_x = true;
                    tile->flipped_y = true;
                    tile->is_duplicate = true;
                }
            }
        }
    }

    return tile;
}